

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O2

void __thiscall chrono::ChArchiveExplorer::ClearSearch(ChArchiveExplorer *this)

{
  pointer ppCVar1;
  ChValue *pCVar2;
  int i;
  ulong uVar3;
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this->found = false;
  this->find_all = false;
  this->found_obj = false;
  this->tablevel = 0;
  ppCVar1 = (this->results).
            super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->results).super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppCVar1) {
    (this->results).super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppCVar1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->search_tokens);
  std::__cxx11::string::string((string *)&local_38,"",&local_39);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->search_tokens,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  uVar3 = 0;
  (this->in_array).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       (this->in_array).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  (this->in_array).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  std::vector<bool,_std::allocator<bool>_>::push_back(&this->in_array,false);
  while( true ) {
    ppCVar1 = (this->results).
              super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->results).
                      super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3) <= uVar3)
    break;
    pCVar2 = ppCVar1[uVar3];
    if (pCVar2 != (ChValue *)0x0) {
      (*pCVar2->_vptr_ChValue[1])();
    }
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void ClearSearch() {
        this->found = false;
        this->find_all = false;
        this->found_obj = false;
        this->tablevel = 0;
        this->results.clear();
        this->search_tokens.clear();
        this->search_tokens.push_back(""); // for root lavel
        this->in_array.clear();
        this->in_array.push_back(false); // for root level
        for (int i=0; i<this->results.size(); ++i) {
            delete (this->results[i]);
        }
      }